

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O0

int h2o_cache_set(h2o_cache_t *cache,uint64_t now,h2o_iovec_t key,h2o_cache_hashcode_t keyhash,
                 h2o_iovec_t value)

{
  h2o_cache_ref_t *__dest;
  bool bVar1;
  int local_a4;
  undefined1 auStack_a0 [4];
  int unused;
  h2o_cache_hashcode_t local_90;
  uint64_t local_88;
  char *local_80;
  size_t local_78;
  undefined4 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  uint local_40;
  uint local_3c;
  int existed;
  khiter_t iter;
  h2o_cache_ref_t *newref;
  uint64_t uStack_28;
  h2o_cache_hashcode_t keyhash_local;
  uint64_t now_local;
  h2o_cache_t *cache_local;
  h2o_iovec_t key_local;
  
  key_local.base = (char *)key.len;
  cache_local = (h2o_cache_t *)key.base;
  newref._4_4_ = keyhash;
  uStack_28 = now;
  now_local = (uint64_t)cache;
  if (keyhash == 0) {
    newref._4_4_ = h2o_cache_calchash((char *)cache_local,(size_t)key_local.base);
  }
  __dest = (h2o_cache_ref_t *)h2o_mem_alloc(0x60);
  _existed = __dest;
  _auStack_a0 = h2o_strdup((h2o_mem_pool_t *)0x0,(char *)cache_local,(size_t)key_local.base);
  local_90 = newref._4_4_;
  local_88 = uStack_28;
  local_80 = value.base;
  local_78 = value.len;
  local_70 = 0;
  local_68 = 0;
  local_60 = 0;
  local_58 = 0;
  local_50 = 0;
  local_48 = 1;
  memcpy(__dest,auStack_a0,0x60);
  lock_cache((h2o_cache_t *)now_local);
  local_3c = kh_get_cache(*(kh_cache_t **)(now_local + 8),_existed);
  bVar1 = local_3c == **(khint_t **)(now_local + 8);
  if (bVar1) {
    kh_put_cache(*(kh_cache_t **)(now_local + 8),_existed,&local_a4);
  }
  else {
    erase_ref((h2o_cache_t *)now_local,local_3c,1);
    *(h2o_cache_ref_t **)(*(long *)(*(long *)(now_local + 8) + 0x18) + (ulong)local_3c * 8) =
         _existed;
  }
  local_40 = (uint)!bVar1;
  h2o_linklist_insert((h2o_linklist_t *)(now_local + 0x20),&_existed->_lru_link);
  h2o_linklist_insert((h2o_linklist_t *)(now_local + 0x30),&_existed->_age_link);
  *(size_t *)(now_local + 0x10) = (_existed->value).len + *(long *)(now_local + 0x10);
  purge((h2o_cache_t *)now_local,uStack_28);
  unlock_cache((h2o_cache_t *)now_local);
  return local_40;
}

Assistant:

int h2o_cache_set(h2o_cache_t *cache, uint64_t now, h2o_iovec_t key, h2o_cache_hashcode_t keyhash, h2o_iovec_t value)
{
    h2o_cache_ref_t *newref;
    khiter_t iter;
    int existed;

    if (keyhash == 0)
        keyhash = h2o_cache_calchash(key.base, key.len);

    /* create newref */
    newref = h2o_mem_alloc(sizeof(*newref));
    *newref = (h2o_cache_ref_t){h2o_strdup(NULL, key.base, key.len), keyhash, now, value, 0, {NULL}, {NULL}, 1};

    lock_cache(cache);

    /* set or replace the named value */
    iter = kh_get(cache, cache->table, newref);
    if (iter != kh_end(cache->table)) {
        erase_ref(cache, iter, 1);
        kh_key(cache->table, iter) = newref;
        existed = 1;
    } else {
        int unused;
        kh_put(cache, cache->table, newref, &unused);
        existed = 0;
    }
    h2o_linklist_insert(&cache->lru, &newref->_lru_link);
    h2o_linklist_insert(&cache->age, &newref->_age_link);
    cache->size += newref->value.len;

    purge(cache, now);

    unlock_cache(cache);

    return existed;
}